

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitArraySet(PrintExpressionContents *this,ArraySet *curr)

{
  bool bVar1;
  HeapType type;
  TypeNamePrinter local_70;
  
  bVar1 = printUnreachableOrNullReplacement(this,curr->ref);
  if (!bVar1) {
    printMedium(this->o,"array.set ");
    local_70.wasm = this->wasm;
    local_70.os = this->o;
    local_70.currHeapTypeDepth = 0;
    local_70.heapTypeDepths._M_h._M_buckets = &local_70.heapTypeDepths._M_h._M_single_bucket;
    local_70.heapTypeDepths._M_h._M_bucket_count = 1;
    local_70.heapTypeDepths._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_70.heapTypeDepths._M_h._M_element_count = 0;
    local_70.heapTypeDepths._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_70.heapTypeDepths._M_h._M_rehash_policy._M_next_resize = 0;
    local_70.heapTypeDepths._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_70.prints = 0;
    type = wasm::Type::getHeapType(&curr->ref->type);
    anon_unknown_217::TypeNamePrinter::print(&local_70,type);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_70.heapTypeDepths._M_h);
  }
  return;
}

Assistant:

void visitArraySet(ArraySet* curr) {
    if (printUnreachableOrNullReplacement(curr->ref)) {
      return;
    }
    printMedium(o, "array.set ");
    TypeNamePrinter(o, wasm).print(curr->ref->type.getHeapType());
  }